

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_logging.cc
# Opt level: O3

void google::RawLog__(LogSeverity severity,char *file,int line,char *format,...)

{
  char cVar1;
  void *__src;
  char in_AL;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *format_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char local_cd8 [8];
  char buffer [3000];
  undefined1 local_118 [32];
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  va_list ap;
  char *buf;
  size_t size;
  LogSeverity local_38;
  int local_34;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_f8 = in_R8;
  local_f0 = in_R9;
  size = (size_t)file;
  local_34 = line;
  if ((((fLB::FLAGS_logtostderr != '\0') || (fLI::FLAGS_stderrthreshold <= severity)) ||
      (fLB::FLAGS_alsologtostderr != '\0')) || (bVar2 = IsGoogleLoggingInitialized(), !bVar2)) {
    ap[0].reg_save_area = local_cd8;
    buf = (char *)0xbb8;
    cVar1 = **(char **)(LogSeverityNames + (long)severity * 8);
    local_38 = severity;
    uVar4 = glog_internal_namespace_::GetTID();
    pcVar5 = glog_internal_namespace_::const_basename((char *)size);
    DoRawLog((char **)&ap[0].reg_save_area,(size_t *)&buf,
             "%c00000000 00:00:00.000000 %5u %s:%d] RAW: ",(ulong)(uint)(int)cVar1,(ulong)uVar4,
             pcVar5,local_34);
    pcVar5 = buf;
    __src = ap[0].reg_save_area;
    ap[0].overflow_arg_area = local_118;
    ap[0]._0_8_ = &stack0x00000008;
    local_68 = 0x3000000020;
    uVar4 = vsnprintf((char *)ap[0].reg_save_area,(size_t)buf,format,&local_68);
    format_00 = "RAW_LOG ERROR: The Message was too long!\n";
    if (-1 < (int)uVar4) {
      pcVar6 = (char *)(ulong)uVar4;
      if (pcVar6 <= pcVar5) {
        ap[0].reg_save_area = pcVar6 + (long)__src;
        format_00 = "\n";
        buf = pcVar5 + -(long)pcVar6;
      }
    }
    DoRawLog((char **)&ap[0].reg_save_area,(size_t *)&buf,format_00);
    sVar7 = strlen(local_cd8);
    syscall(1,2,local_cd8,sVar7);
    if (local_38 == 3) {
      LOCK();
      bVar3 = crashed;
      if (crashed == 0) {
        crashed = 1;
        bVar3 = 0;
      }
      UNLOCK();
      if ((bVar3 & 1) == 0) {
        crash_reason._0_8_ = size;
        crash_reason._8_4_ = local_34;
        memcpy(crash_buf,__src,(size_t)pcVar5);
        crash_reason._16_8_ = crash_buf;
        crash_reason._280_4_ = GetStackTrace((void **)(crash_reason + 0x18),0x20,1);
        glog_internal_namespace_::SetCrashReason((CrashReason *)crash_reason);
      }
      LogMessage::Fail();
    }
  }
  return;
}

Assistant:

void RawLog__(LogSeverity severity, const char* file, int line,
              const char* format, ...) {
  if (!(FLAGS_logtostderr || severity >= FLAGS_stderrthreshold ||
        FLAGS_alsologtostderr || !IsGoogleLoggingInitialized())) {
    return;  // this stderr log message is suppressed
  }
  // can't call localtime_r here: it can allocate
  char buffer[kLogBufSize];
  char* buf = buffer;
  size_t size = sizeof(buffer);

  // NOTE: this format should match the specification in base/logging.h
  DoRawLog(&buf, &size, "%c00000000 00:00:00.000000 %5u %s:%d] RAW: ",
           LogSeverityNames[severity][0],
           static_cast<unsigned int>(GetTID()),
           const_basename(const_cast<char *>(file)), line);

  // Record the position and size of the buffer after the prefix
  const char* msg_start = buf;
  const size_t msg_size = size;

  va_list ap;
  va_start(ap, format);
  bool no_chop = VADoRawLog(&buf, &size, format, ap);
  va_end(ap);
  if (no_chop) {
    DoRawLog(&buf, &size, "\n");
  } else {
    DoRawLog(&buf, &size, "RAW_LOG ERROR: The Message was too long!\n");
  }
  // We make a raw syscall to write directly to the stderr file descriptor,
  // avoiding FILE buffering (to avoid invoking malloc()), and bypassing
  // libc (to side-step any libc interception).
  // We write just once to avoid races with other invocations of RawLog__.
  safe_write(STDERR_FILENO, buffer, strlen(buffer));
  if (severity == GLOG_FATAL)  {
    if (!sync_val_compare_and_swap(&crashed, false, true)) {
      crash_reason.filename = file;
      crash_reason.line_number = line;
      memcpy(crash_buf, msg_start, msg_size);  // Don't include prefix
      crash_reason.message = crash_buf;
#ifdef HAVE_STACKTRACE
      crash_reason.depth =
          GetStackTrace(crash_reason.stack, ARRAYSIZE(crash_reason.stack), 1);
#else
      crash_reason.depth = 0;
#endif
      SetCrashReason(&crash_reason);
    }
    LogMessage::Fail();  // abort()
  }
}